

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O2

void checkForError(bool condition,int line,string *message)

{
  runtime_error *this;
  undefined7 in_register_00000039;
  string sStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((int)CONCAT71(in_register_00000039,condition) != 0) {
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&sStack_98,line);
  std::operator+(&local_78,"VulkanHppGenerator: Spec error on line ",&sStack_98);
  std::operator+(&local_58,&local_78,": ");
  std::operator+(&local_38,&local_58,message);
  std::runtime_error::runtime_error(this,(string *)&local_38);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void checkForError( bool condition, int line, std::string const & message )
{
  if ( !condition )
  {
    throw std::runtime_error( "VulkanHppGenerator: Spec error on line " + std::to_string( line ) + ": " + message );
  }
}